

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void glob_dsp(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  int newstate;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  void *dummy_local;
  
  if (argc == 0) {
    post("dsp state %d",(ulong)(uint)(pd_maininstance.pd_gui)->i_dspstate);
  }
  else {
    tVar2 = atom_getfloatarg(0,argc,argv);
    if (((int)tVar2 == 0) || ((pd_maininstance.pd_gui)->i_dspstate != 0)) {
      if (((int)tVar2 == 0) && ((pd_maininstance.pd_gui)->i_dspstate != 0)) {
        canvas_stop_dsp();
        iVar1 = audio_shouldkeepopen();
        if (iVar1 == 0) {
          sys_set_audio_state(0);
        }
      }
    }
    else {
      sys_set_audio_state(1);
      canvas_start_dsp();
    }
  }
  return;
}

Assistant:

void glob_dsp(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int newstate;
    if (argc)
    {
        newstate = atom_getfloatarg(0, argc, argv);
        if (newstate && !THISGUI->i_dspstate)
        {
            sys_set_audio_state(1);
            canvas_start_dsp();
        }
        else if (!newstate && THISGUI->i_dspstate)
        {
            canvas_stop_dsp();
            if (!audio_shouldkeepopen())
                sys_set_audio_state(0);
        }
    }
    else post("dsp state %d", THISGUI->i_dspstate);
}